

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::Cluster::distribute(Cluster *this,ClusterList *clst,BoxDomain *bd)

{
  bool bVar1;
  Cluster *in_RDI;
  Cluster *c;
  const_iterator End;
  const_iterator bdi;
  Cluster *in_stack_ffffffffffffff98;
  Cluster *c_00;
  Cluster *in_stack_ffffffffffffffa0;
  bool local_49;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_20 [4];
  
  local_20[0]._M_current = (Box *)BoxList::begin((BoxList *)in_stack_ffffffffffffff98);
  BoxList::end((BoxList *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff98);
    local_49 = false;
    c_00 = in_stack_ffffffffffffff98;
    if (bVar1) {
      local_49 = ok(in_RDI);
      c_00 = in_stack_ffffffffffffff98;
    }
    if (local_49 == false) break;
    in_stack_ffffffffffffff98 = (Cluster *)operator_new(0x30);
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator*(local_20);
    Cluster(this,(Cluster *)clst,(Box *)bd);
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff98;
    bVar1 = ok(in_stack_ffffffffffffff98);
    if (bVar1) {
      ClusterList::append((ClusterList *)in_stack_ffffffffffffffa0,c_00);
      in_stack_ffffffffffffff98 = c_00;
    }
    else if (in_stack_ffffffffffffff98 != (Cluster *)0x0) {
      ~Cluster(in_stack_ffffffffffffff98);
      operator_delete(in_stack_ffffffffffffff98,0x30);
    }
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_20);
  }
  return;
}

Assistant:

void
Cluster::distribute (ClusterList&     clst,
                     const BoxDomain& bd)
{
    BL_ASSERT(ok());
    BL_ASSERT(bd.ok());
    BL_ASSERT(clst.length() == 0);

    for (BoxDomain::const_iterator bdi = bd.begin(), End = bd.end();
         bdi != End && ok();
         ++bdi)
    {
        Cluster* c = new Cluster(*this, *bdi);

        if (c->ok())
            clst.append(c);
        else
            delete c;
    }
}